

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.cpp
# Opt level: O3

void __thiscall jsonChildren::inc(jsonChildren *this)

{
  if (this->mysize != this->mycapacity) {
    return;
  }
  inc();
  return;
}

Assistant:

void jsonChildren::inc(void) json_nothrow {
    JSON_ASSERT(this != 0, JSON_TEXT("Children is null inc"));
    if (json_unlikely(mysize == mycapacity)){  //it's full
	   if (json_unlikely(mycapacity == 0)){  //the array hasn't been created yet
		  JSON_ASSERT(!array, JSON_TEXT("Expanding a 0 capacity array, but not null"));
		  #ifdef JSON_LESS_MEMORY
			 array = json_malloc<JSONNode*>(1);
			 mycapacity = 1;
		  #else
			 array = json_malloc<JSONNode*>(8);  //8 seems average for JSON, and it's only 64 bytes
			 mycapacity = 8;
		  #endif
	   } else {
		  #ifdef JSON_LESS_MEMORY
			 mycapacity += 1;  //increment the size of the array
		  #else
			 mycapacity <<= 1;  //double the size of the array
		  #endif
		  array = json_realloc<JSONNode*>(array, mycapacity);
	   }
    }
}